

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedConditionalDispatching::Run(AdvancedConditionalDispatching *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  RenderTarget *pRVar2;
  bool bVar3;
  GLuint GVar4;
  GLint GVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool *compile_error;
  bool *compile_error_00;
  char *format;
  int h;
  int *data_00;
  vec4 *in_R9;
  long lVar7;
  allocator<char> local_7a;
  allocator<char> local_79;
  int data;
  uint uStack_74;
  size_type sStack_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nuniform float g_depth;\nuniform vec2[3] g_vertex = vec2[3](vec2(-1, -1), vec2(3, -1), vec2(-1, 3));\nvoid main() {\n  gl_Position = vec4(g_vertex[gl_VertexID], g_depth, 1);\n}"
             ,&local_79);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "\nlayout(location = 0) out vec4 g_color;\nvoid main() {\n  g_color = vec4(0, 1, 0, 1);\n}"
             ,&local_7a);
  GVar4 = ComputeShaderBase::CreateProgram(&this->super_ComputeShaderBase,(string *)&data,&local_50)
  ;
  this->m_program_vsfs = GVar4;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&data);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program_vsfs);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program_vsfs,compile_error);
  lVar7 = -1;
  if (!bVar3) {
    return -1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&data,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  int g_output;\n};\nvoid main() {\n  atomicAdd(g_output, 1);\n}"
             ,(allocator<char> *)&local_50);
  GVar4 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)&data);
  this->m_program_cs = GVar4;
  std::__cxx11::string::~string((string *)&data);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program_cs);
  bVar3 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program_cs,compile_error_00);
  if (!bVar3) {
    return -1;
  }
  _data = (pointer)((ulong)uStack_74 << 0x20);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&data,0x88ea);
  _data = (pointer)0x200000002;
  sStack_70 = CONCAT44(sStack_70._4_4_,2);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&data,0x88e4);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glGenQueries(this_00,2,this->m_query);
  glu::CallLogWrapper::glEnable(this_00,0xb71);
  glu::CallLogWrapper::glClear(this_00,0x4100);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program_vsfs);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
  glu::CallLogWrapper::glBeginQuery(this_00,0x8c2f,this->m_query[0]);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program_vsfs,"g_depth");
  glu::CallLogWrapper::glUniform1f(this_00,GVar5,0.0);
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
  glu::CallLogWrapper::glEndQuery(this_00,0x8c2f);
  glu::CallLogWrapper::glBeginQuery(this_00,0x8c2f,this->m_query[1]);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program_vsfs,"g_depth");
  glu::CallLogWrapper::glUniform1f(this_00,GVar5,0.5);
  glu::CallLogWrapper::glDrawArrays(this_00,4,0,3);
  glu::CallLogWrapper::glEndQuery(this_00,0x8c2f);
  glu::CallLogWrapper::glDisable(this_00,0xb71);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program_cs);
  glu::CallLogWrapper::glBeginConditionalRender(this_00,this->m_query[0],0x8e13);
  glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
  glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  glu::CallLogWrapper::glEndConditionalRender(this_00);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,&data);
  if (data == 0x10) {
    glu::CallLogWrapper::glBeginConditionalRender(this_00,this->m_query[1],0x8e13);
    glu::CallLogWrapper::glDispatchCompute(this_00,2,2,2);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
    glu::CallLogWrapper::glEndConditionalRender(this_00);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
    data_00 = &data;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,4,data_00);
    h = (int)data_00;
    if (data == 0x10) {
LAB_009d0e5c:
      iVar6 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                m_renderCtx->_vptr_RenderContext[4])();
      if (*(int *)(CONCAT44(extraout_var,iVar6) + 0x18) == 0) {
        format = "Data is %d should be 32.\n";
        uVar1 = data;
        goto LAB_009d0e9c;
      }
    }
    else {
      iVar6 = (*((this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.m_context)->
                m_renderCtx->_vptr_RenderContext[4])();
      if (*(int *)(CONCAT44(extraout_var_00,iVar6) + 0x18) != 0) goto LAB_009d0e95;
      if (data != 0x20) goto LAB_009d0e5c;
    }
    pRVar2 = (this->super_ComputeShaderBase).renderTarget;
    _data = (pointer)0x3f80000000000000;
    sStack_70 = 0x3f80000000000000;
    bVar3 = ComputeShaderBase::ValidateReadBuffer
                      (&this->super_ComputeShaderBase,pRVar2->m_width,pRVar2->m_height,(int)&data,h,
                       in_R9);
    lVar7 = (ulong)bVar3 - 1;
  }
  else {
LAB_009d0e95:
    format = "Data is %d should be 16.\n";
    uVar1 = data;
LAB_009d0e9c:
    anon_unknown_0::Output(format,(ulong)uVar1);
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = NL
			"uniform float g_depth;" NL "uniform vec2[3] g_vertex = vec2[3](vec2(-1, -1), vec2(3, -1), vec2(-1, 3));" NL
			"void main() {" NL "  gl_Position = vec4(g_vertex[gl_VertexID], g_depth, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_color;" NL "void main() {" NL "  g_color = vec4(0, 1, 0, 1);" NL "}";

		m_program_vsfs = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program_vsfs);
		if (!CheckProgram(m_program_vsfs))
			return ERROR;

		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  int g_output;" NL "};" NL
			   "void main() {" NL "  atomicAdd(g_output, 1);" NL "}";
		m_program_cs = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program_cs);
		if (!CheckProgram(m_program_cs))
			return ERROR;

		/* create storage buffer */
		{
			const int data = 0;
			glGenBuffers(1, &m_storage_buffer);
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_DYNAMIC_COPY);
		}
		/* create dispatch buffer */
		{
			const GLuint data[3] = { 2, 2, 2 };
			glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
		}

		glGenVertexArrays(1, &m_vertex_array);
		glGenQueries(2, m_query);

		glEnable(GL_DEPTH_TEST);
		glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

		glUseProgram(m_program_vsfs);
		glBindVertexArray(m_vertex_array);

		// this draw call will pass depth test
		glBeginQuery(GL_ANY_SAMPLES_PASSED, m_query[0]);
		glUniform1f(glGetUniformLocation(m_program_vsfs, "g_depth"), 0.0f);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndQuery(GL_ANY_SAMPLES_PASSED);

		// this draw call will NOT pass depth test
		glBeginQuery(GL_ANY_SAMPLES_PASSED, m_query[1]);
		glUniform1f(glGetUniformLocation(m_program_vsfs, "g_depth"), 0.5f);
		glDrawArrays(GL_TRIANGLES, 0, 3);
		glEndQuery(GL_ANY_SAMPLES_PASSED);

		glDisable(GL_DEPTH_TEST);

		glUseProgram(m_program_cs);

		// these commands should be executed normally
		glBeginConditionalRender(m_query[0], GL_QUERY_WAIT);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchComputeIndirect(0);
		glEndConditionalRender();

		/* validate */
		{
			int data;
			glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 16)
			{
				Output("Data is %d should be 16.\n", data);
				return ERROR;
			}
		}

		// these commands should be discarded
		glBeginConditionalRender(m_query[1], GL_QUERY_WAIT);
		glDispatchCompute(2, 2, 2);
		glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
		glDispatchComputeIndirect(0);
		glEndConditionalRender();

		/* validate */
		{
			int data;
			glMemoryBarrier(GL_SHADER_STORAGE_BARRIER_BIT);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), &data);
			if (data != 16 && m_context.getRenderContext().getRenderTarget().getDepthBits() != 0)
			{
				Output("Data is %d should be 16.\n", data);
				return ERROR;
			}
			else if (data != 32 && m_context.getRenderContext().getRenderTarget().getDepthBits() == 0)
			{
				Output("Data is %d should be 32.\n", data);
				return ERROR;
			}
		}

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}

		return NO_ERROR;
	}